

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DTDScanner::scanElementDecl(DTDScanner *this)

{
  uint uVar1;
  ReaderMgr *this_00;
  DTDGrammar *pDVar2;
  XMLScanner *this_01;
  bool bVar3;
  int iVar4;
  ValSchemes VVar5;
  XMLBuffer *toFill;
  XMLCh *pXVar6;
  undefined4 extraout_var;
  XMLValidator *this_02;
  DTDElementDecl *pDVar7;
  DTDElementDecl *pDStack_38;
  bool isIgnored;
  DTDElementDecl *decl;
  undefined1 local_20 [8];
  XMLBufBid bbName;
  DTDScanner *this_local;
  
  bbName.fMgr = (XMLBufferMgr *)this;
  bVar3 = checkForPERef(this,false,true);
  if (!bVar3) {
    XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
  }
  XMLBufBid::XMLBufBid((XMLBufBid *)local_20,this->fBufMgr);
  this_00 = this->fReaderMgr;
  toFill = XMLBufBid::getBuffer((XMLBufBid *)local_20);
  bVar3 = ReaderMgr::getName(this_00,toFill);
  if (bVar3) {
    pDVar2 = this->fDTDGrammar;
    uVar1 = this->fEmptyNamespaceId;
    pXVar6 = XMLBufBid::getRawBuffer((XMLBufBid *)local_20);
    iVar4 = (*(pDVar2->super_Grammar).super_XSerializable._vptr_XSerializable[0xb])
                      (pDVar2,(ulong)uVar1,0,pXVar6,0xfffffffe);
    pDStack_38 = (DTDElementDecl *)CONCAT44(extraout_var,iVar4);
    if (pDStack_38 == (DTDElementDecl *)0x0) {
      pDStack_38 = (DTDElementDecl *)XMemory::operator_new(0x58,this->fGrammarPoolMemoryManager);
      pXVar6 = XMLBufBid::getRawBuffer((XMLBufBid *)local_20);
      DTDElementDecl::DTDElementDecl
                (pDStack_38,pXVar6,this->fEmptyNamespaceId,Any,this->fGrammarPoolMemoryManager);
      (*(this->fDTDGrammar->super_Grammar).super_XSerializable._vptr_XSerializable[0x11])
                (this->fDTDGrammar,pDStack_38,0);
    }
    else {
      bVar3 = XMLElementDecl::isDeclared((XMLElementDecl *)pDStack_38);
      if (bVar3) {
        VVar5 = XMLScanner::getValidationScheme(this->fScanner);
        if (VVar5 == Val_Always) {
          this_02 = XMLScanner::getValidator(this->fScanner);
          pXVar6 = XMLBufBid::getRawBuffer((XMLBufBid *)local_20);
          XMLValidator::emitError
                    (this_02,ElementAlreadyExists,pXVar6,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
        if (this->fDumElemDecl == (DTDElementDecl *)0x0) {
          pDVar7 = (DTDElementDecl *)XMemory::operator_new(0x58,this->fMemoryManager);
          pXVar6 = XMLBufBid::getRawBuffer((XMLBufBid *)local_20);
          DTDElementDecl::DTDElementDecl
                    (pDVar7,pXVar6,this->fEmptyNamespaceId,Any,this->fMemoryManager);
          this->fDumElemDecl = pDVar7;
        }
        else {
          pDVar7 = this->fDumElemDecl;
          pXVar6 = XMLBufBid::getRawBuffer((XMLBufBid *)local_20);
          XMLElementDecl::setElementName
                    (&pDVar7->super_XMLElementDecl,pXVar6,this->fEmptyNamespaceId);
        }
      }
    }
    pDVar7 = this->fDumElemDecl;
    bVar3 = isReadingExternalEntity(this);
    XMLElementDecl::setExternalElemDeclaration(&pDStack_38->super_XMLElementDecl,bVar3);
    XMLElementDecl::setCreateReason(&pDStack_38->super_XMLElementDecl,Declared);
    bVar3 = checkForPERef(this,false,true);
    if (!bVar3) {
      XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
    }
    bVar3 = scanContentSpec(this,pDStack_38);
    if (bVar3) {
      checkForPERef(this,false,true);
      bVar3 = ReaderMgr::skippedChar(this->fReaderMgr,L'>');
      if (!bVar3) {
        this_01 = this->fScanner;
        pXVar6 = XMLBufBid::getRawBuffer((XMLBufBid *)local_20);
        XMLScanner::emitError
                  (this_01,UnterminatedElementDecl,pXVar6,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
      }
      if (this->fDocTypeHandler != (DocTypeHandler *)0x0) {
        (*this->fDocTypeHandler->_vptr_DocTypeHandler[7])
                  (this->fDocTypeHandler,pDStack_38,(ulong)(pDStack_38 == pDVar7));
      }
    }
    else {
      ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
    }
  }
  else {
    XMLScanner::emitError(this->fScanner,ExpectedElementName);
    ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
  }
  XMLBufBid::~XMLBufBid((XMLBufBid *)local_20);
  return;
}

Assistant:

void DTDScanner::scanElementDecl()
{
    //
    //  Space is legal (required actually) here so check for a PE ref. If
    //  we don't get our whitespace, then issue and error, but try to keep
    //  going.
    //
    if (!checkForPERef(false, true))
        fScanner->emitError(XMLErrs::ExpectedWhitespace);

    // Get a buffer for the element name and scan in the name
    XMLBufBid bbName(fBufMgr);
    if (!fReaderMgr->getName(bbName.getBuffer()))
    {
        fScanner->emitError(XMLErrs::ExpectedElementName);
        fReaderMgr->skipPastChar(chCloseAngle);
        return;
    }

    // Look this guy up in the element decl pool
    DTDElementDecl* decl = (DTDElementDecl*) fDTDGrammar->getElemDecl(fEmptyNamespaceId, 0, bbName.getRawBuffer(), Grammar::TOP_LEVEL_SCOPE);

    //
    //  If it does not exist, then we need to create it. If it does and
    //  its marked as declared, then that's an error, but we still need to
    //  scan over the content model so use the dummy declaration that the
    //  parsing code can fill in.
    //
    if (decl)
    {
        if (decl->isDeclared())
        {
            if (fScanner->getValidationScheme() == XMLScanner::Val_Always)
                fScanner->getValidator()->emitError(XMLValid::ElementAlreadyExists, bbName.getRawBuffer());

            if (!fDumElemDecl)
                fDumElemDecl = new (fMemoryManager) DTDElementDecl
                (
                    bbName.getRawBuffer()
                    , fEmptyNamespaceId
                    , DTDElementDecl::Any
                    , fMemoryManager
                );
            else
                fDumElemDecl->setElementName(bbName.getRawBuffer(),fEmptyNamespaceId);
        }
    }
     else
    {
        //
        //  Create the new empty declaration to fill in and put it into
        //  the decl pool.
        //
        decl = new (fGrammarPoolMemoryManager) DTDElementDecl
        (
            bbName.getRawBuffer()
            , fEmptyNamespaceId
            , DTDElementDecl::Any
            , fGrammarPoolMemoryManager
        );
        fDTDGrammar->putElemDecl(decl);
    }

    // Set a flag for whether we will ignore this one
    const bool isIgnored = (decl == fDumElemDecl);

    // Mark this one if being externally declared
    decl->setExternalElemDeclaration(isReadingExternalEntity());

    // Mark this one as being declared
    decl->setCreateReason(XMLElementDecl::Declared);

    // Another check for a PE ref, with at least required whitespace
    if (!checkForPERef(false, true))
        fScanner->emitError(XMLErrs::ExpectedWhitespace);

    // And now scan the content model for this guy.
    if (!scanContentSpec(*decl))
    {
        fReaderMgr->skipPastChar(chCloseAngle);
        return;
    }

    // Another check for a PE ref, but we don't require whitespace here
    checkForPERef(false, true);

    // And we should have the ending angle bracket
    if (!fReaderMgr->skippedChar(chCloseAngle))
    {
        fScanner->emitError(XMLErrs::UnterminatedElementDecl, bbName.getRawBuffer());
        fReaderMgr->skipPastChar(chCloseAngle);
    }

    //
    //  If we have a DTD handler tell it about the new element decl. We
    //  tell it if its one that can be ignored, cause its an override of a
    //  previously existing decl. If it is being ignored, only call back
    //  if advanced callbacks are enabled.
    //
    if (fDocTypeHandler)
        fDocTypeHandler->elementDecl(*decl, isIgnored);
}